

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

plutovg_color_t resolve_current_color(render_context_t *context,element_t *element)

{
  color_t local_30;
  color_t color;
  element_t *element_local;
  render_context_t *context_local;
  float fStack_c;
  
  local_30.type = color_type_current;
  local_30.value = 0;
  color = (color_t)element;
  parse_color(element,4,&local_30,true);
  if (local_30.type == color_type_fixed) {
    _context_local = convert_color(&local_30);
  }
  else if (*(long *)((long)color + 8) == 0) {
    if (context->current_color == (plutovg_color_t *)0x0) {
      _context_local = ZEXT812(0);
      fStack_c = 1.0;
    }
    else {
      _context_local = *context->current_color;
    }
  }
  else {
    _context_local = resolve_current_color(context,*(element_t **)((long)color + 8));
  }
  return _context_local;
}

Assistant:

static plutovg_color_t resolve_current_color(const render_context_t* context, const element_t* element)
{
    color_t color = {color_type_current};
    parse_color(element, ATTR_COLOR, &color, true);
    if(color.type == color_type_fixed)
        return convert_color(&color);
    if(element->parent == NULL) {
        if(context->current_color)
            return *context->current_color;
        return PLUTOVG_BLACK_COLOR;
    }

    return resolve_current_color(context, element->parent);
}